

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O2

uint32_t get_I(istream *is)

{
  istream *piVar1;
  uint uVar2;
  char ch;
  char local_59;
  uint32_t local_58;
  allocator<char> local_51;
  string local_50;
  
  local_58 = 0;
  do {
    uVar2 = 0;
    while( true ) {
      while( true ) {
        if (2 < uVar2) {
          return local_58;
        }
        piVar1 = std::operator>>(is,&local_59);
        if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
          return local_58;
        }
        if (local_59 != 'I') break;
        local_58 = local_58 + 1;
        uVar2 = uVar2 + 1;
      }
      if (local_59 == 'V') break;
      if (local_59 == 'X') {
        return local_58 + 8;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Invalid roman numeral.",&local_51);
      error(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (uVar2 != 0) {
      return local_58 + 3;
    }
    local_58 = local_58 + 5;
  } while( true );
}

Assistant:

uint32_t get_I(std::istream& is)
{
	uint32_t num{ 0 };
	char ch;
	uint32_t repeats{ 0 };
	while (repeats < Roman_int::max_repeating_numerals && is >> ch)
	{
		switch (ch)
		{
		case 'X':
			return num + 8;
		case 'V':
		{
			if (repeats > 0)
			{
				return num + 3;
			}
			else
			{
				num += 5;
			}
			break;
		}
		case 'I':
		{
			num += 1;
			++repeats;
			break;
		}
		default:
			error("Invalid roman numeral.");
		}
	}
	return num;
}